

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

void upb_MtDecoder_PushOneof(upb_MtDecoder *d,upb_OneOfLayoutItem item)

{
  short *psVar1;
  ulong uVar2;
  upb_OneOfLayoutItem *puVar3;
  ulong uVar4;
  char *fmt;
  size_t sVar5;
  
  if (item.field_index == 0xffff) {
    fmt = "Empty oneof";
LAB_004ece4f:
    upb_MdDecoder_ErrorJmp(&d->base,fmt);
  }
  puVar3 = (d->oneofs).data;
  uVar4 = (d->oneofs).size;
  uVar2 = (d->oneofs).buf_capacity_bytes;
  if (uVar2 < uVar4 * 4 + 4) {
    sVar5 = 0x20;
    if ((uVar4 & 0x7ffffffffffffffc) != 0) {
      sVar5 = uVar4 * 8;
    }
    puVar3 = (upb_OneOfLayoutItem *)(*upb_alloc_global.func)(&upb_alloc_global,puVar3,uVar2,sVar5);
    (d->oneofs).data = puVar3;
    if (puVar3 == (upb_OneOfLayoutItem *)0x0) {
      fmt = "Out of memory";
      goto LAB_004ece4f;
    }
    (d->oneofs).buf_capacity_bytes = sVar5;
    uVar4 = (d->oneofs).size;
  }
  d->rep_counts_offsets[1] = d->rep_counts_offsets[1] + 1;
  psVar1 = (short *)((long)d->rep_counts_offsets + (ulong)((uint)item >> 0xf & 0x1fe));
  *psVar1 = *psVar1 + 1;
  (d->oneofs).size = uVar4 + 1;
  puVar3[uVar4].field_index = item.field_index - 3;
  puVar3[uVar4].rep = item.rep;
  puVar3[uVar4].field_0x3 = item._3_1_;
  return;
}

Assistant:

static void upb_MtDecoder_PushOneof(upb_MtDecoder* d,
                                    upb_OneOfLayoutItem item) {
  if (item.field_index == kUpb_OneOfLayoutItem_IndexSentinel) {
    upb_MdDecoder_ErrorJmp(&d->base, "Empty oneof");
  }
  if ((d->oneofs.size + 1) * sizeof(*d->oneofs.data) >
      d->oneofs.buf_capacity_bytes) {
    size_t new_cap = UPB_MAX(8, d->oneofs.size * 2) * sizeof(*d->oneofs.data);
    d->oneofs.data =
        upb_grealloc(d->oneofs.data, d->oneofs.buf_capacity_bytes, new_cap);
    upb_MdDecoder_CheckOutOfMemory(&d->base, d->oneofs.data);
    d->oneofs.buf_capacity_bytes = new_cap;
  }
  item.field_index -= kOneofBase;

  d->rep_counts_offsets[kUpb_OneOf_CaseFieldRep]++;
  d->rep_counts_offsets[item.rep]++;
  d->oneofs.data[d->oneofs.size++] = item;
}